

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int UTF8ToUTF16BE(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  byte *pbVar2;
  byte bVar4;
  uint uVar3;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  iVar6 = (int)in;
  iVar1 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar6 = 0;
      iVar1 = 0;
    }
    else {
      iVar10 = (int)out;
      if (0 < (long)*inlen) {
        pbVar7 = in + *inlen;
        pbVar2 = out + ((long)*outlen & 0xfffffffffffffffe);
        iVar1 = -3;
        do {
          bVar4 = *in;
          if ((char)bVar4 < '\0') {
            if (bVar4 < 0xe0) {
              if (0xc1 < bVar4) {
                uVar12 = bVar4 & 0x1f;
                uVar11 = 0x80;
                lVar14 = 2;
                goto LAB_0012cea6;
              }
LAB_0012cf12:
              iVar5 = 4;
              iVar1 = -2;
            }
            else {
              lVar14 = 4 - (ulong)(bVar4 < 0xf0);
              uVar11 = 0x10000;
              if (bVar4 < 0xf0) {
                uVar11 = 0x800;
              }
              uVar12 = bVar4 & 0xf;
LAB_0012cea6:
              iVar5 = 3;
              if ((long)pbVar7 - (long)in < lVar14) goto LAB_0012cf17;
              lVar8 = 1;
              do {
                uVar13 = uVar12;
                iVar5 = 4;
                if ((in[lVar8] & 0xc0) != 0x80) goto LAB_0012cf12;
                uVar3 = uVar13 << 6;
                uVar12 = in[lVar8] & 0x3f | uVar3;
                lVar8 = lVar8 + 1;
              } while (lVar14 != lVar8);
              if ((uVar12 < uVar11) || (0x10ffff < uVar3 || (uVar13 & 0x3ffffe0) == 0x360))
              goto LAB_0012cf12;
              bVar4 = (byte)(uVar3 >> 8);
              if (uVar3 < 0x10000) {
                if (out < pbVar2) {
                  *out = bVar4;
                  lVar8 = 2;
                  lVar9 = 1;
LAB_0012cf8b:
                  out[lVar9] = (byte)uVar12;
                  out = out + lVar8;
                  in = in + lVar14;
                  iVar5 = 0;
                }
              }
              else if (3 < (long)pbVar2 - (long)out) {
                *out = (byte)(uVar12 - 0x10000 >> 0x12) | 0xd8;
                out[1] = (byte)(uVar12 - 0x10000 >> 10);
                out[2] = bVar4 & 3 | 0xdc;
                lVar8 = 4;
                lVar9 = 3;
                goto LAB_0012cf8b;
              }
            }
LAB_0012cf17:
            if (iVar5 != 0) {
              if (iVar5 != 3) {
                if (iVar5 != 4) {
                  return iVar1;
                }
                goto LAB_0012cfba;
              }
              break;
            }
          }
          else {
            if (pbVar2 <= out) goto LAB_0012cfba;
            *out = 0;
            out[1] = bVar4;
            in = in + 1;
            out = out + 2;
          }
        } while (in < pbVar7);
      }
      iVar1 = (int)out - iVar10;
LAB_0012cfba:
      *outlen = (int)out - iVar10;
      iVar6 = (int)in - iVar6;
    }
    *inlen = iVar6;
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16BE(unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              void *vctxt ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF-16BE has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = 0;
            out[1] = c;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c >> 8;
                out[1] = c & 0xFF;
                out[2] = d >> 8;
                out[3] = d & 0xFF;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}